

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t_const&>
          (SmallVectorBase<slang::logic_t> *this,logic_t *args)

{
  size_type sVar1;
  ulong uVar2;
  pointer plVar3;
  pointer plVar4;
  pointer plVar5;
  pointer plVar6;
  pointer plVar7;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  EVP_PKEY_CTX *n;
  
  plVar7 = this->data_ + this->len;
  if (this->len != this->cap) {
    plVar7->value = args->value;
    sVar1 = this->len;
    this->len = sVar1 + 1;
    return this->data_ + sVar1;
  }
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  n = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (n < ctx) {
    n = ctx;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    n = (EVP_PKEY_CTX *)0x7fffffffffffffff;
  }
  lVar8 = (long)plVar7 - (long)this->data_;
  plVar3 = (pointer)operator_new((size_t)n);
  plVar3[lVar8].value = args->value;
  plVar6 = this->data_;
  plVar4 = plVar6 + this->len;
  plVar5 = plVar3;
  if (plVar4 == plVar7) {
    for (; plVar6 != plVar7; plVar6 = plVar6 + 1) {
      plVar5->value = plVar6->value;
      plVar5 = plVar5 + 1;
    }
  }
  else {
    for (; plVar6 != plVar7; plVar6 = plVar6 + 1) {
      ctx = (EVP_PKEY_CTX *)CONCAT71((int7)((ulong)ctx >> 8),plVar6->value);
      plVar5->value = plVar6->value;
      plVar5 = plVar5 + 1;
    }
    plVar6 = plVar3 + lVar8;
    for (; plVar6 = plVar6 + 1, plVar7 != plVar4; plVar7 = plVar7 + 1) {
      plVar6->value = plVar7->value;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)n;
  this->data_ = plVar3;
  return plVar3 + lVar8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }